

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database.cpp
# Opt level: O0

void __thiscall Database::changeUserAlias(Database *this,int id,string *alias)

{
  sqlite3 *db;
  int iVar1;
  char *pcVar2;
  DatabaseException *this_00;
  ostream *this_01;
  string local_128 [39];
  allocator local_101;
  string local_100 [8];
  string error;
  __cxx11 local_d8 [4];
  int failure;
  string local_a8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48 [8];
  string query;
  char *local_28;
  char *errorMsg;
  string *alias_local;
  Database *pDStack_10;
  int id_local;
  Database *this_local;
  
  local_28 = (char *)0x0;
  errorMsg = (char *)alias;
  alias_local._4_4_ = id;
  pDStack_10 = this;
  std::operator+((char *)local_a8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 "update user set alias = \'");
  std::operator+(local_88,(char *)local_a8);
  std::__cxx11::to_string(local_d8,alias_local._4_4_);
  std::operator+(local_68,local_88);
  std::operator+(local_48,(char *)local_68);
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::~string((string *)local_d8);
  std::__cxx11::string::~string((string *)local_88);
  std::__cxx11::string::~string(local_a8);
  db = this->database;
  pcVar2 = (char *)std::__cxx11::string::c_str();
  iVar1 = sqlite3_exec(db,pcVar2,(sqlite3_callback)0x0,(void *)0x0,&local_28);
  pcVar2 = local_28;
  if (iVar1 != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_100,pcVar2,&local_101);
    std::allocator<char>::~allocator((allocator<char> *)&local_101);
    sqlite3_free(local_28);
    this_00 = (DatabaseException *)__cxa_allocate_exception(0x28);
    std::operator+((char *)local_128,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "Error while changing alias: ");
    DatabaseException::DatabaseException(this_00,local_128);
    __cxa_throw(this_00,&DatabaseException::typeinfo,DatabaseException::~DatabaseException);
  }
  this_01 = std::operator<<((ostream *)&std::cout,"Alias changed successfully");
  std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void Database::changeUserAlias(int id, std::string alias)
{
	char* errorMsg = nullptr;
	std::string query = "update user set alias = '" + alias + "' where id = " + std::to_string(id) + " ;";

	int failure = sqlite3_exec(database, query.c_str(), nullptr, nullptr, &errorMsg);

	if(failure)
	{
		std::string error(errorMsg);
		sqlite3_free(errorMsg);
		throw DatabaseException("Error while changing alias: " + error);
	}
	else
	{
		std::cout << "Alias changed successfully" << std::endl;
	}
}